

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ipc-heavy-traffic-deadlock-bug.c
# Opt level: O2

void do_writes_and_reads(uv_stream_t *handle)

{
  int iVar1;
  void *pvVar2;
  undefined8 uVar3;
  long lVar4;
  char *pcVar5;
  void *__s;
  long lVar6;
  undefined1 auVar7 [16];
  undefined8 auStack_70 [8];
  
  bytes_written = 0;
  bytes_read = 0;
  lVar6 = 0;
  do {
    if (lVar6 == 0x100) {
      auStack_70[0] = 0x138457;
      iVar1 = uv_read_start(handle,alloc_cb,read_cb);
      if (iVar1 == 0) {
        auStack_70[0] = 0x13846a;
        iVar1 = uv_run(handle->loop,0);
        if (iVar1 == 0) {
          if (bytes_written == 0x600000) {
            if (bytes_read == 0x600000) {
              return;
            }
            pcVar5 = "bytes_read == XFER_SIZE";
            uVar3 = 0x82;
          }
          else {
            pcVar5 = "bytes_written == XFER_SIZE";
            uVar3 = 0x81;
          }
        }
        else {
          pcVar5 = "r == 0";
          auStack_70[0] = 0x7f;
          uVar3 = auStack_70[0];
        }
      }
      else {
        pcVar5 = "r == 0";
        auStack_70[0] = 0x7c;
        uVar3 = auStack_70[0];
      }
LAB_001384e8:
      auStack_70[0] = 0x1384ef;
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ipc-heavy-traffic-deadlock-bug.c"
              ,uVar3,pcVar5);
      auStack_70[0] = 0x1384f4;
      abort();
    }
    auStack_70[0] = 0x1383ca;
    pvVar2 = malloc(0x60c0);
    if (pvVar2 == (void *)0x0) {
      pcVar5 = "write_info != NULL";
      auStack_70[0] = 0x45;
      uVar3 = auStack_70[0];
      goto LAB_001384e8;
    }
    __s = (void *)((long)pvVar2 + 0xc0);
    for (lVar4 = 8; lVar4 != 0x38; lVar4 = lVar4 + 0x10) {
      auStack_70[0] = 0x1383f9;
      memset(__s,0x2a,0x2000);
      auStack_70[0] = 0x138406;
      auVar7 = uv_buf_init(__s,0x2000);
      *(long *)((long)auStack_70 + lVar4) = auVar7._0_8_;
      *(long *)((long)auStack_70 + lVar4 + 8U) = auVar7._8_8_;
      __s = (void *)((long)__s + 3);
    }
    auStack_70[0] = 0x138431;
    iVar1 = uv_write(pvVar2,handle,auStack_70 + 1,3,write_cb);
    if (iVar1 != 0) {
      pcVar5 = "r == 0";
      auStack_70[0] = 0x4e;
      uVar3 = auStack_70[0];
      goto LAB_001384e8;
    }
    lVar6 = lVar6 + 1;
  } while( true );
}

Assistant:

static void do_writes_and_reads(uv_stream_t* handle) {
  size_t i;
  int r;

  bytes_written = 0;
  bytes_read = 0;

  for (i = 0; i < NUM_WRITES; i++) {
    do_write(handle);
  }

  r = uv_read_start(handle, alloc_cb, read_cb);
  ASSERT(r == 0);

  r = uv_run(handle->loop, UV_RUN_DEFAULT);
  ASSERT(r == 0);

  ASSERT(bytes_written == XFER_SIZE);
  ASSERT(bytes_read == XFER_SIZE);
}